

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

int __thiscall geemuboi::core::CPU::ret_c(CPU *this)

{
  uint16_t *puVar1;
  Registers *pRVar2;
  int iVar3;
  
  iVar3 = 2;
  if ((this->regs->f & 0x10) != 0) {
    iVar3 = (*this->mmu->_vptr_IMmu[1])(this->mmu,(ulong)this->regs->sp);
    pRVar2 = this->regs;
    pRVar2->pc = (uint16_t)iVar3;
    puVar1 = &pRVar2->sp;
    *puVar1 = *puVar1 + 2;
    iVar3 = 5;
  }
  return iVar3;
}

Assistant:

int CPU::ret_c() {
    if (regs.f & 0x10) {
        regs.pc = mmu.read_word(regs.sp);
        regs.sp += 2;
        return 5;
    } else {
        return 2;
    }
}